

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktShaderRenderTextureFunctionTests.cpp
# Opt level: O0

float __thiscall
vkt::sr::anon_unknown_0::TextureQueryLodInstance::computeLevelFromLod
          (TextureQueryLodInstance *this,float computedLod)

{
  FilterMode FVar1;
  int iVar2;
  float fVar3;
  int maxAccessibleLevel;
  float computedLod_local;
  TextureQueryLodInstance *this_local;
  
  iVar2 = ((this->super_TextureQueryInstance).m_textureSpec)->numLevels + -1;
  fVar3 = deFloatClamp(computedLod,0.0,(float)iVar2);
  FVar1 = (((this->super_TextureQueryInstance).m_textureSpec)->sampler).minFilter;
  if (FVar1 < NEAREST_MIPMAP_NEAREST) {
    return 0.0;
  }
  if (FVar1 != NEAREST_MIPMAP_NEAREST) {
    if (FVar1 == NEAREST_MIPMAP_LINEAR) {
      return fVar3;
    }
    if (FVar1 != LINEAR_MIPMAP_NEAREST) {
      if (FVar1 == LINEAR_MIPMAP_LINEAR) {
        return fVar3;
      }
      return 0.0;
    }
  }
  fVar3 = deFloatCeil(fVar3 + 0.5);
  fVar3 = deFloatClamp(fVar3 - 1.0,0.0,(float)iVar2);
  return fVar3;
}

Assistant:

float TextureQueryLodInstance::computeLevelFromLod (float computedLod) const
{
	const int	maxAccessibleLevel	= m_textureSpec.numLevels - 1;

	// Clamp the computed LOD to the range of accessible levels.
	computedLod = deFloatClamp(computedLod, 0.0f, (float)maxAccessibleLevel);

	// Return a value according to the min filter.
	switch (m_textureSpec.sampler.minFilter)
	{
		case tcu::Sampler::LINEAR:
		case tcu::Sampler::NEAREST:
			return 0.0f;

		case tcu::Sampler::NEAREST_MIPMAP_NEAREST:
		case tcu::Sampler::LINEAR_MIPMAP_NEAREST:
			return deFloatClamp(deFloatCeil(computedLod + 0.5f) - 1.0f, 0.0f, (float)maxAccessibleLevel);

		case tcu::Sampler::NEAREST_MIPMAP_LINEAR:
		case tcu::Sampler::LINEAR_MIPMAP_LINEAR:
			return computedLod;

		default:
			DE_ASSERT(false);
			return 0.0f;
	}
}